

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::http_stream::handshake2<libtorrent::aux::peer_connection::start()::__0>
          (http_stream *this,error_code *e,anon_class_16_1_898a5c2a *h)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  char *pcVar4;
  anon_class_16_1_898a5c2a *u;
  __0 local_d8 [16];
  http_stream *local_c8;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__http_stream_hpp:188:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_peer_connection_cpp:424:6)>
  local_c0;
  mutable_buffer local_a8;
  vector<char,_std::allocator<char>_> local_98;
  undefined1 local_80 [8];
  error_code ec_1;
  undefined1 local_58 [4];
  int code;
  error_code ec;
  char *status;
  size_type sStack_28;
  bool found_end;
  size_t read_pos;
  anon_class_16_1_898a5c2a *h_local;
  error_code *e_local;
  http_stream *this_local;
  
  read_pos = (size_t)h;
  h_local = (anon_class_16_1_898a5c2a *)e;
  e_local = (error_code *)this;
  bVar1 = proxy_base::handle_error<libtorrent::aux::peer_connection::start()::__0&>
                    (&this->super_proxy_base,e,h);
  if (!bVar1) {
    sStack_28 = ::std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
    status._7_1_ = 0;
    if ((2 < sStack_28) &&
       (pvVar3 = ::std::vector<char,_std::allocator<char>_>::operator[]
                           (&this->m_buffer,sStack_28 - 1), *pvVar3 == '\n')) {
      pvVar3 = ::std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,sStack_28 - 2)
      ;
      if (*pvVar3 == '\n') {
        status._7_1_ = 1;
      }
      else if ((((4 < sStack_28) &&
                (pvVar3 = ::std::vector<char,_std::allocator<char>_>::operator[]
                                    (&this->m_buffer,sStack_28 - 2), *pvVar3 == '\r')) &&
               (pvVar3 = ::std::vector<char,_std::allocator<char>_>::operator[]
                                   (&this->m_buffer,sStack_28 - 3), *pvVar3 == '\n')) &&
              (pvVar3 = ::std::vector<char,_std::allocator<char>_>::operator[]
                                  (&this->m_buffer,sStack_28 - 4), *pvVar3 == '\r')) {
        status._7_1_ = 1;
      }
    }
    if ((status._7_1_ & 1) == 0) {
      ::std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,sStack_28 + 1);
      pcVar4 = ::std::vector<char,_std::allocator<char>_>::data(&this->m_buffer);
      local_a8 = boost::asio::buffer(pcVar4 + sStack_28,1);
      u = (anon_class_16_1_898a5c2a *)local_a8.data_;
      local_c8 = this;
      peer_connection::start()::$_0::__0(local_d8,h);
      wrap_allocator<libtorrent::aux::http_stream::handshake2<libtorrent::aux::peer_connection::start()::__0>(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,unsigned_long,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>
                (&local_c0,(aux *)local_c8,(http_stream *)local_d8,u);
      boost::asio::
      async_read<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::aux::http_stream::handshake2<libtorrent::aux::peer_connection::start()::__0>(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,unsigned_long,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>>
                ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                  *)this,&local_a8,&local_c0,(type *)0x0);
      wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/http_stream.hpp:188:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:424:6)>
      ::~wrap_allocator_t(&local_c0);
      peer_connection::start()::$_0::~__0(local_d8);
    }
    else {
      status._6_1_ = 0;
      ::std::vector<char,_std::allocator<char>_>::push_back
                (&this->m_buffer,(value_type *)((long)&status + 6));
      pcVar4 = ::std::vector<char,_std::allocator<char>_>::data(&this->m_buffer);
      pcVar4 = strchr(pcVar4,0x20);
      if (pcVar4 == (char *)0x0) {
        boost::system::error_code::error_code<boost::asio::error::basic_errors>
                  ((error_code *)&ec.cat_,operation_not_supported,(type *)0x0);
        peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,(error_code *)&ec.cat_);
        boost::system::error_code::error_code((error_code *)local_58);
        close(this,(int)local_58);
      }
      else {
        iVar2 = atoi(pcVar4 + 1);
        if (iVar2 == 200) {
          peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,(error_code *)h_local);
          memset(&local_98,0,0x18);
          ::std::vector<char,_std::allocator<char>_>::vector(&local_98);
          ::std::vector<char,_std::allocator<char>_>::swap(&local_98,&this->m_buffer);
          ::std::vector<char,_std::allocator<char>_>::~vector(&local_98);
        }
        else {
          boost::system::error_code::error_code<boost::asio::error::basic_errors>
                    ((error_code *)&ec_1.cat_,operation_not_supported,(type *)0x0);
          peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,(error_code *)&ec_1.cat_);
          boost::system::error_code::error_code((error_code *)local_80);
          close(this,(int)local_80);
        }
      }
    }
  }
  return;
}

Assistant:

void handshake2(error_code const& e, Handler h)
	{
		if (handle_error(e, h)) return;

		std::size_t const read_pos = m_buffer.size();
		// look for \n\n and \r\n\r\n
		// both of which means end of http response header
		bool found_end = false;
		if (read_pos > 2 && m_buffer[read_pos - 1] == '\n')
		{
			if (m_buffer[read_pos - 2] == '\n')
			{
				found_end = true;
			}
			else if (read_pos > 4
				&& m_buffer[read_pos - 2] == '\r'
				&& m_buffer[read_pos - 3] == '\n'
				&& m_buffer[read_pos - 4] == '\r')
			{
				found_end = true;
			}
		}

		if (found_end)
		{
			m_buffer.push_back(0);
			char const* status = std::strchr(m_buffer.data(), ' ');
			if (status == nullptr)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			status++;
			int const code = std::atoi(status);
			if (code != 200)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		// read another byte from the socket
		m_buffer.resize(read_pos + 1);
		async_read(m_sock, boost::asio::buffer(m_buffer.data() + read_pos, 1), wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				handshake2(ec, std::move(hn));
			}, std::move(h)));
	}